

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O2

cmValue cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>
                  (cmGeneratorTarget *tgt,string *prop,cmMakefile *mf)

{
  bool bVar1;
  cmValue cVar2;
  
  cVar2 = GetLocation<cmGeneratorTarget>(tgt,prop,mf);
  if (cVar2.Value == (string *)0x0) {
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (!bVar1) {
      bVar1 = std::operator==(prop,"SOURCES");
      if (bVar1) {
        cVar2 = cmGeneratorTarget::GetSourcesProperty(tgt);
        return (cmValue)cVar2.Value;
      }
    }
    cVar2.Value = (string *)0x0;
  }
  return (cmValue)cVar2.Value;
}

Assistant:

static cmValue GetProperty(Target const* tgt, const std::string& prop,
                             cmMakefile const& mf)
  {
    if (cmValue loc = GetLocation(tgt, prop, mf)) {
      return loc;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      return nullptr;
    }
    if (prop == "SOURCES") {
      return GetSources(tgt, mf);
    }
    return nullptr;
  }